

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlaterIntegrals.hpp
# Opt level: O1

RealType RosenD(int m,int n,int p)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  RealType *pRVar6;
  double dVar7;
  
  uVar1 = n + m + p;
  if ((int)uVar1 < 0x98) {
    uVar1 = 0;
    if (0 < p - m) {
      uVar1 = p - m;
    }
    iVar2 = n;
    if (p < n) {
      iVar2 = p;
    }
    dVar7 = 0.0;
    if ((int)uVar1 <= iVar2) {
      uVar4 = (ulong)uVar1;
      pRVar6 = fact + -uVar4;
      lVar5 = (long)(m - p) + uVar4;
      lVar3 = 0;
      do {
        if ((uVar1 + (int)lVar3 & 1) == 0) {
          dVar7 = dVar7 + (fact[n] / (pRVar6[n] * fact[lVar3 + uVar4])) *
                          (fact[m] / (pRVar6[p] * fact[lVar3 + lVar5]));
        }
        else {
          dVar7 = dVar7 - (fact[n] / (pRVar6[n] * fact[lVar3 + uVar4])) *
                          (fact[m] / (pRVar6[p] * fact[lVar3 + lVar5]));
        }
        lVar3 = lVar3 + 1;
        pRVar6 = pRVar6 + -1;
      } while ((uVar4 - (iVar2 + 1)) + lVar3 != 0);
    }
    return dVar7;
  }
  printf("Error, arguments exceed maximum factorial computed %d > %d\n",(ulong)uVar1,0x97);
  exit(0);
}

Assistant:

inline RealType RosenD(int m, int n, int p) {
  if (m + n + p > maxFact) {
    printf("Error, arguments exceed maximum factorial computed %d > %d\n",
           m + n + p, maxFact);
    ::exit(0);
  }

  RealType RosenD_ = 0;
  for (int k = max(p - m, 0); k <= min(n, p); k++) {
    if (mod(k, 2) == 0)
      RosenD_ += (fact[m] / (fact[p - k] * fact[m - p + k])) *
                 (fact[n] / (fact[n - k] * fact[k]));
    else
      RosenD_ -= (fact[m] / (fact[p - k] * fact[m - p + k])) *
                 (fact[n] / (fact[n - k] * fact[k]));
  }
  return RosenD_;
}